

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setFixedWidth(QWidget *this,int w)

{
  ushort uVar1;
  QWidgetPrivate *this_00;
  long lVar2;
  QWExtra *pQVar3;
  int iVar4;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  QWidgetPrivate::createExtra(this_00);
  lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (lVar2 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = *(int *)(lVar2 + 100);
  }
  uVar1 = *(ushort *)
           &((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
  setMinimumSize(this,w,iVar4);
  lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (lVar2 == 0) {
    iVar4 = 0xffffff;
  }
  else {
    iVar4 = *(int *)(lVar2 + 0x6c);
  }
  setMaximumSize(this,w,iVar4);
  pQVar3 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  *(ushort *)&pQVar3->field_0x7c =
       ((ushort)*(undefined4 *)&pQVar3->field_0x7c & 0xfffc) + (uVar1 & 2) + 1;
  pQVar3 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  *(ushort *)&pQVar3->field_0x7c =
       ((ushort)*(undefined4 *)&pQVar3->field_0x7c & 0xfff3) + (uVar1 & 8) + 4;
  return;
}

Assistant:

void QWidget::setFixedWidth(int w)
{
    Q_D(QWidget);
    d->createExtra();
    uint explMin = d->extra->explicitMinSize | Qt::Horizontal;
    uint explMax = d->extra->explicitMaxSize | Qt::Horizontal;
    setMinimumSize(w, minimumSize().height());
    setMaximumSize(w, maximumSize().height());
    d->extra->explicitMinSize = explMin;
    d->extra->explicitMaxSize = explMax;
}